

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.cpp
# Opt level: O0

bool __thiscall
r_comp::Compiler::read_set
          (Compiler *this,Ptr *node,bool enforce,Class *p,uint16_t write_index,
          uint16_t *extent_index,bool write)

{
  byte bVar1;
  uint16_t *extent_index_00;
  uint16_t write_index_00;
  bool bVar2;
  shared_ptr<r_comp::RepliStruct> local_148;
  allocator local_131;
  string local_130 [32];
  shared_ptr<r_comp::RepliStruct> local_110;
  shared_ptr<r_comp::RepliStruct> local_100;
  shared_ptr<r_comp::RepliStruct> local_f0;
  shared_ptr<r_comp::RepliStruct> local_e0;
  shared_ptr<r_comp::RepliStruct> local_d0;
  Class local_c0;
  shared_ptr<r_comp::RepliStruct> local_78 [2];
  shared_ptr<r_comp::RepliStruct> local_58;
  byte local_41;
  uint16_t *puStack_40;
  bool write_local;
  uint16_t *extent_index_local;
  Class *pCStack_30;
  uint16_t write_index_local;
  Class *p_local;
  Ptr *pPStack_20;
  bool enforce_local;
  Ptr *node_local;
  Compiler *this_local;
  
  local_41 = write;
  puStack_40 = extent_index;
  extent_index_local._6_2_ = write_index;
  pCStack_30 = p;
  p_local._7_1_ = enforce;
  pPStack_20 = node;
  node_local = (Ptr *)this;
  std::shared_ptr<r_comp::RepliStruct>::shared_ptr(&local_58,node);
  bVar2 = read_nil_set(this,&local_58,extent_index_local._6_2_,puStack_40,(bool)(local_41 & 1));
  std::shared_ptr<r_comp::RepliStruct>::~shared_ptr(&local_58);
  if (bVar2) {
    this_local._7_1_ = true;
  }
  else {
    std::shared_ptr<r_comp::RepliStruct>::shared_ptr(local_78,node);
    write_index_00 = extent_index_local._6_2_;
    extent_index_00 = puStack_40;
    bVar1 = local_41;
    Class::Class(&local_c0,SET);
    bVar2 = read_variable(this,local_78,write_index_00,extent_index_00,(bool)(bVar1 & 1),&local_c0);
    Class::~Class(&local_c0);
    std::shared_ptr<r_comp::RepliStruct>::~shared_ptr(local_78);
    if (bVar2) {
      this_local._7_1_ = true;
    }
    else {
      std::shared_ptr<r_comp::RepliStruct>::shared_ptr(&local_d0,node);
      bVar2 = read_reference(this,&local_d0,extent_index_local._6_2_,puStack_40,(bool)(local_41 & 1)
                             ,SET);
      std::shared_ptr<r_comp::RepliStruct>::~shared_ptr(&local_d0);
      if (bVar2) {
        this_local._7_1_ = true;
      }
      else {
        std::shared_ptr<r_comp::RepliStruct>::shared_ptr(&local_e0,node);
        bVar2 = read_wildcard(this,&local_e0,extent_index_local._6_2_,puStack_40,
                              (bool)(local_41 & 1));
        std::shared_ptr<r_comp::RepliStruct>::~shared_ptr(&local_e0);
        if (bVar2) {
          this_local._7_1_ = true;
        }
        else {
          std::shared_ptr<r_comp::RepliStruct>::shared_ptr(&local_f0,node);
          bVar2 = read_tail_wildcard(this,&local_f0,extent_index_local._6_2_,puStack_40,
                                     (bool)(local_41 & 1));
          std::shared_ptr<r_comp::RepliStruct>::~shared_ptr(&local_f0);
          if (bVar2) {
            this_local._7_1_ = true;
          }
          else {
            if (pCStack_30 == (Class *)0x0) {
              std::shared_ptr<r_comp::RepliStruct>::shared_ptr(&local_110,node);
              bVar2 = set(this,&local_110,extent_index_local._6_2_,puStack_40,(bool)(local_41 & 1));
              std::shared_ptr<r_comp::RepliStruct>::~shared_ptr(&local_110);
              if (bVar2) {
                return true;
              }
            }
            else {
              std::shared_ptr<r_comp::RepliStruct>::shared_ptr(&local_100,node);
              bVar2 = set(this,&local_100,pCStack_30,extent_index_local._6_2_,puStack_40,
                          (bool)(local_41 & 1));
              std::shared_ptr<r_comp::RepliStruct>::~shared_ptr(&local_100);
              if (bVar2) {
                return true;
              }
            }
            if ((p_local._7_1_ & 1) == 0) {
              this_local._7_1_ = false;
            }
            else {
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_130," error: expected a set",&local_131);
              std::shared_ptr<r_comp::RepliStruct>::shared_ptr(&local_148,node);
              set_error(this,(string *)local_130,&local_148);
              std::shared_ptr<r_comp::RepliStruct>::~shared_ptr(&local_148);
              std::__cxx11::string::~string(local_130);
              std::allocator<char>::~allocator((allocator<char> *)&local_131);
              this_local._7_1_ = false;
            }
          }
        }
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool Compiler::read_set(RepliStruct::Ptr node, bool enforce, const Class *p, uint16_t write_index, uint16_t &extent_index, bool write)
{
    if (read_nil_set(node, write_index, extent_index, write)) {
        return true;
    } else if (read_variable(node, write_index, extent_index, write, Class(SET))) {
        return true;
    } else if (read_reference(node, write_index, extent_index, write, SET)) {
        return true;
    } else if (read_wildcard(node, write_index, extent_index, write)) {
        return true;
    } else if (read_tail_wildcard(node, write_index, extent_index, write)) {
        return true;
    }

    if (p) {
        if (set(node, *p, write_index, extent_index, write)) {
            return true;
        }
    } else if (set(node, write_index, extent_index, write)) {
        return true;
    }

    if (enforce) {
        set_error(" error: expected a set", node);
        return false;
    }

    return false;
}